

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# router.cpp
# Opt level: O0

void forwardMessageCMD(packet_t *recv)

{
  packet_t *ppVar1;
  __type _Var2;
  undefined8 uVar3;
  ostream *poVar4;
  string local_2c8;
  allocator<char> local_2a1;
  string local_2a0 [32];
  string local_280;
  allocator<char> local_259;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  undefined1 local_198 [8];
  string msg;
  string local_158;
  string local_138;
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_48 [8];
  string dst;
  int local_20;
  int msgLength;
  int f4;
  int f3;
  int f2;
  int f1;
  packet_t *recv_local;
  
  dst.field_2._12_4_ = 0;
  _f2 = recv;
  uVar3 = std::__cxx11::string::data();
  __isoc99_sscanf(uVar3,"%*s %d.%d.%d.%d %d",&f3,&f4,&msgLength,&local_20,
                  (undefined1 *)((long)&dst.field_2 + 0xc));
  std::__cxx11::to_string(&local_108,f3);
  std::operator+(&local_e8,&local_108,".");
  std::__cxx11::to_string(&local_138,f4);
  std::operator+(&local_c8,&local_e8,&local_138);
  std::operator+(&local_a8,&local_c8,".");
  std::__cxx11::to_string(&local_158,msgLength);
  std::operator+(&local_88,&local_a8,&local_158);
  std::operator+(&local_68,&local_88,".");
  std::__cxx11::to_string((string *)((long)&msg.field_2 + 8),local_20);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                 &local_68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&msg.field_2 + 8));
  std::__cxx11::string::~string((string *)(msg.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  ppVar1 = _f2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_258,"frwd",&local_259);
  std::operator+(&local_238,&local_258," ");
  std::operator+(&local_218,&local_238,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
  std::operator+(&local_1f8,&local_218," ");
  std::__cxx11::to_string(&local_280,dst.field_2._12_4_);
  std::operator+(&local_1d8,&local_1f8,&local_280);
  std::operator+(&local_1b8,&local_1d8," ");
  std::__cxx11::string::length();
  std::__cxx11::string::substr((ulong)local_198,(ulong)ppVar1);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator(&local_259);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2a0,"frwd",&local_2a1);
  poVar4 = std::operator<<((ostream *)&std::cout,local_2a0);
  poVar4 = std::operator<<(poVar4,"> ");
  poVar4 = std::operator<<(poVar4,(string *)local_48);
  poVar4 = std::operator<<(poVar4," ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,dst.field_2._12_4_);
  poVar4 = std::operator<<(poVar4," ");
  poVar4 = std::operator<<(poVar4,(string *)local_198);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_2a0);
  std::allocator<char>::~allocator(&local_2a1);
  Socket::getLocalIP_abi_cxx11_(&local_2c8,&socketLocal);
  _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_48,&local_2c8);
  std::__cxx11::string::~string((string *)&local_2c8);
  if (_Var2) {
    poVar4 = std::operator<<((ostream *)&std::cout,"{");
    poVar4 = std::operator<<(poVar4,(string *)local_198);
    poVar4 = std::operator<<(poVar4,"}");
    poVar4 = std::operator<<(poVar4," packet reached destination (printed by ");
    poVar4 = std::operator<<(poVar4,(string *)local_48);
    poVar4 = std::operator<<(poVar4,")");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  else {
    forwardMessageToNextHop((routerip_t *)local_48,(string *)local_198,_f2);
  }
  std::__cxx11::string::~string((string *)local_198);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void forwardMessageCMD(const packet_t &recv) {
	int f1, f2, f3, f4;
	int msgLength = 0;
	sscanf(recv.data(), "%*s %d.%d.%d.%d %d", &f1, &f2, &f3, &f4, &msgLength);
	string dst = to_string(f1) + "." + to_string(f2) + "." + to_string(f3) + "." + to_string(f4);
	string msg = recv.substr((FORWARD_MESSAGE + " " + dst + " " + to_string(msgLength) + " ").length(),
	                         static_cast<unsigned long>(msgLength));
	cout << FORWARD_MESSAGE << "> " << dst << " " << msgLength << " " << msg << endl;
	if (dst == socketLocal.getLocalIP()) {
		cout << "{" << msg << "}" << " packet reached destination (printed by " << dst << ")" << endl;;
	} else
		forwardMessageToNextHop(dst, msg, recv);
}